

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TempInputText
               (ImRect *bb,ImGuiID id,char *label,char *buf,int buf_size,ImGuiInputTextFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiID in_ESI;
  ImVec2 *in_RDI;
  bool bVar3;
  bool value_changed;
  bool init;
  ImGuiContext *g;
  ImGuiInputTextFlags in_stack_00000634;
  ImVec2 *in_stack_00000638;
  int in_stack_00000644;
  char *in_stack_00000648;
  char *in_stack_00000650;
  char *in_stack_00000658;
  ImGuiInputTextCallback in_stack_00000670;
  void *in_stack_00000678;
  ImRect *in_stack_ffffffffffffff98;
  
  pIVar1 = GImGui;
  bVar3 = GImGui->TempInputId != in_ESI;
  if (bVar3) {
    ClearActiveID();
  }
  (pIVar1->CurrentWindow->DC).CursorPos = *in_RDI;
  ImRect::GetSize(in_stack_ffffffffffffff98);
  bVar2 = InputTextEx(in_stack_00000658,in_stack_00000650,in_stack_00000648,in_stack_00000644,
                      in_stack_00000638,in_stack_00000634,in_stack_00000670,in_stack_00000678);
  if (bVar3) {
    pIVar1->TempInputId = pIVar1->ActiveId;
  }
  return bVar2;
}

Assistant:

bool ImGui::TempInputText(const ImRect& bb, ImGuiID id, const char* label, char* buf, int buf_size, ImGuiInputTextFlags flags)
{
    // On the first frame, g.TempInputTextId == 0, then on subsequent frames it becomes == id.
    // We clear ActiveID on the first frame to allow the InputText() taking it back.
    ImGuiContext& g = *GImGui;
    const bool init = (g.TempInputId != id);
    if (init)
        ClearActiveID();

    g.CurrentWindow->DC.CursorPos = bb.Min;
    bool value_changed = InputTextEx(label, NULL, buf, buf_size, bb.GetSize(), flags | ImGuiInputTextFlags_MergedItem);
    if (init)
    {
        // First frame we started displaying the InputText widget, we expect it to take the active id.
        IM_ASSERT(g.ActiveId == id);
        g.TempInputId = g.ActiveId;
    }
    return value_changed;
}